

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.cpp
# Opt level: O2

Element __thiscall ftxui::MenuBase::Render(MenuBase *this)

{
  int iVar1;
  MenuBase *pMVar2;
  bool bVar3;
  size_t sVar4;
  long lVar5;
  ComponentBase *pCVar6;
  ComponentBase **ppCVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ComponentBase *in_RSI;
  long lVar8;
  char *__lhs;
  code *pcVar9;
  long lVar10;
  int iVar11;
  ulong i;
  Element EVar12;
  Elements elements;
  Decorator style;
  vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_> local_198;
  code *local_180;
  ComponentBase *local_178;
  MenuBase *local_170;
  ComponentBase *local_168;
  ComponentBase *local_160;
  ComponentBase *local_158;
  long local_150;
  undefined1 local_148 [16];
  Element local_138;
  _Any_data local_128;
  code *local_118;
  code *local_110;
  ftxui local_108 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_100;
  ftxui local_f8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f0;
  vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_> local_e8;
  function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)> local_d0;
  function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)> local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  Decorator local_50;
  
  local_198.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_198.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_198.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar3 = ComponentBase::Focused(in_RSI);
  local_178 = in_RSI + 1;
  sVar4 = ConstStringListRef::size((ConstStringListRef *)local_178);
  local_168 = in_RSI + 7;
  std::vector<ftxui::Box,_std::allocator<ftxui::Box>_>::resize
            ((vector<ftxui::Box,_std::allocator<ftxui::Box>_> *)(in_RSI + 7),sVar4);
  if (bVar3) {
    local_180 = focus;
  }
  else {
    local_180 = select;
  }
  local_158 = (ComponentBase *)
              &in_RSI[1].children_.
               super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
  lVar10 = 0;
  i = 0;
  local_170 = this;
  local_160 = in_RSI;
  while( true ) {
    sVar4 = ConstStringListRef::size((ConstStringListRef *)local_178);
    pMVar2 = local_170;
    if (sVar4 <= i) break;
    pCVar6 = local_160[6].parent_;
    if (local_160[6].parent_ == (ComponentBase *)0x0) {
      pCVar6 = local_158;
    }
    ppCVar7 = &pCVar6[4].parent_;
    if ((ComponentBase **)pCVar6[5]._vptr_ComponentBase != (ComponentBase **)0x0) {
      ppCVar7 = (ComponentBase **)pCVar6[5]._vptr_ComponentBase;
    }
    iVar11 = (int)i;
    iVar1 = *(int *)&((local_160[1].children_.
                       super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish)->
                     super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    lVar5 = (ulong)(iVar11 == *(int *)ppCVar7 && bVar3) * 0x20;
    lVar8 = lVar5 + 0x40;
    if (iVar11 != iVar1) {
      lVar8 = lVar5;
    }
    local_150 = lVar10;
    std::function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)>::function
              (&local_d0,
               (function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)> *)
               ((long)&pCVar6->_vptr_ComponentBase + lVar8));
    pcVar9 = local_180;
    if (iVar11 != iVar1) {
      pcVar9 = nothing;
    }
    ConstStringListRef::operator[][abi_cxx11_(&local_90,(ConstStringListRef *)local_178,i);
    __lhs = "  ";
    if (iVar11 == iVar1) {
      __lhs = "> ";
    }
    std::operator+(&local_70,__lhs,&local_90);
    text((string *)local_148);
    std::function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)>::function
              (&local_b0,&local_d0);
    operator|(local_108,(Element *)local_148,&local_b0);
    local_128._8_8_ = 0;
    local_110 = std::
                _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
                ::_M_invoke;
    local_118 = std::
                _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
                ::_M_manager;
    local_128._M_unused._M_object = pcVar9;
    operator|((ftxui *)&local_138,(Element *)local_108,(Decorator *)&local_128);
    lVar10 = local_150;
    reflect((Box *)((long)&((((_Vector_base<ftxui::Box,_std::allocator<ftxui::Box>_> *)
                             &local_168->_vptr_ComponentBase)->_M_impl).super__Vector_impl_data.
                           _M_start)->x_min + local_150));
    operator|(local_f8,&local_138,&local_50);
    std::vector<std::shared_ptr<ftxui::Node>,std::allocator<std::shared_ptr<ftxui::Node>>>::
    emplace_back<std::shared_ptr<ftxui::Node>>
              ((vector<std::shared_ptr<ftxui::Node>,std::allocator<std::shared_ptr<ftxui::Node>>> *)
               &local_198,(shared_ptr<ftxui::Node> *)local_f8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f0);
    std::_Function_base::~_Function_base(&local_50.super__Function_base);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_138.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::_Function_base::~_Function_base((_Function_base *)&local_128);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_100);
    std::_Function_base::~_Function_base(&local_b0.super__Function_base);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_148 + 8));
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::_Function_base::~_Function_base(&local_d0.super__Function_base);
    i = i + 1;
    lVar10 = lVar10 + 0x10;
  }
  local_e8.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_198.
       super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_e8.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_198.
       super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_e8.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_198.
       super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_198.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_198.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_198.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vbox((Elements *)local_170);
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::~vector
            (&local_e8);
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::~vector
            (&local_198);
  EVar12.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  EVar12.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)pMVar2
  ;
  return (Element)EVar12.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Element Render() {
    Elements elements;
    bool is_menu_focused = Focused();
    boxes_.resize(entries_.size());
    for (size_t i = 0; i < entries_.size(); ++i) {
      bool is_focused = (focused_entry() == int(i)) && is_menu_focused;
      bool is_selected = (*selected_ == int(i));

      auto style = is_selected ? (is_focused ? option_->style_selected_focused
                                             : option_->style_selected)
                               : (is_focused ? option_->style_focused
                                             : option_->style_normal);
      auto focus_management = !is_selected      ? nothing
                              : is_menu_focused ? focus
                                                : select;
      auto icon = is_selected ? "> " : "  ";
      elements.push_back(text(icon + entries_[i]) | style | focus_management |
                         reflect(boxes_[i]));
    }
    return vbox(std::move(elements));
  }